

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ufs_file_base.cpp
# Opt level: O0

int __thiscall foxxll::ufs_file_base::close(ufs_file_base *this,int __fd)

{
  int iVar1;
  int extraout_EAX;
  ostream *poVar2;
  int *piVar3;
  char *pcVar4;
  io_error *this_00;
  string local_1d0;
  ostringstream local_1b0 [8];
  ostringstream msg;
  undefined1 local_20 [8];
  unique_lock<std::mutex> fd_lock;
  ufs_file_base *this_local;
  
  fd_lock._8_8_ = this;
  std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)local_20,&this->fd_mutex_);
  if (this->file_des_ != -1) {
    iVar1 = ::close(this->file_des_);
    if (iVar1 < 0) {
      std::__cxx11::ostringstream::ostringstream(local_1b0);
      poVar2 = std::operator<<((ostream *)local_1b0,"Error in ");
      poVar2 = std::operator<<(poVar2,"void foxxll::ufs_file_base::close()");
      poVar2 = std::operator<<(poVar2," : ");
      poVar2 = std::operator<<(poVar2,"close() fd=");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->file_des_);
      poVar2 = std::operator<<(poVar2," : ");
      piVar3 = __errno_location();
      pcVar4 = strerror(*piVar3);
      std::operator<<(poVar2,pcVar4);
      this_00 = (io_error *)__cxa_allocate_exception(0x20);
      std::__cxx11::ostringstream::str();
      io_error::io_error(this_00,&local_1d0);
      __cxa_throw(this_00,&io_error::typeinfo,io_error::~io_error);
    }
    this->file_des_ = -1;
  }
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_20);
  return extraout_EAX;
}

Assistant:

void ufs_file_base::close()
{
    std::unique_lock<std::mutex> fd_lock(fd_mutex_);

    if (file_des_ == -1)
        return;

    if (::close(file_des_) < 0)
        FOXXLL_THROW_ERRNO(io_error, "close() fd=" << file_des_);

    file_des_ = -1;
}